

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O2

handle_t __thiscall zmq::epoll_t::add_fd(epoll_t *this,fd_t fd_,i_poll_events *events_)

{
  int iVar1;
  fd_t *pfVar2;
  int *piVar3;
  char *errmsg_;
  
  worker_poller_base_t::check_thread(&this->super_worker_poller_base_t);
  pfVar2 = (fd_t *)operator_new(0x18,(nothrow_t *)&std::nothrow);
  if (pfVar2 == (fd_t *)0x0) {
    fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/epoll.cpp"
            ,0x58);
    fflush(_stderr);
    zmq_abort("FATAL ERROR: OUT OF MEMORY");
  }
  *pfVar2 = fd_;
  pfVar2[1] = 0;
  *(fd_t **)(pfVar2 + 2) = pfVar2;
  *(i_poll_events **)(pfVar2 + 4) = events_;
  iVar1 = epoll_ctl(this->_epoll_fd,1,fd_,(epoll_event *)(pfVar2 + 1));
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    errmsg_ = strerror(*piVar3);
    fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/epoll.cpp"
            ,100);
    fflush(_stderr);
    zmq_abort(errmsg_);
  }
  poller_base_t::adjust_load((poller_base_t *)this,1);
  return pfVar2;
}

Assistant:

zmq::epoll_t::handle_t zmq::epoll_t::add_fd (fd_t fd_, i_poll_events *events_)
{
    check_thread ();
    poll_entry_t *pe = new (std::nothrow) poll_entry_t;
    alloc_assert (pe);

    //  The memset is not actually needed. It's here to prevent debugging
    //  tools to complain about using uninitialised memory.
    memset (pe, 0, sizeof (poll_entry_t));

    pe->fd = fd_;
    pe->ev.events = 0;
    pe->ev.data.ptr = pe;
    pe->events = events_;

    const int rc = epoll_ctl (_epoll_fd, EPOLL_CTL_ADD, fd_, &pe->ev);
    errno_assert (rc != -1);

    //  Increase the load metric of the thread.
    adjust_load (1);

    return pe;
}